

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O3

ssize_t __thiscall
MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::read
          (MOS6522<Commodore::C1540::SerialPortVIA> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong uVar6;
  
  access(this,(char *)(ulong)(__fd & 0xfU),(int)__buf);
  switch(__fd & 0xfU) {
  case 0:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar1 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xe7;
    bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable;
    bVar5 = bVar4 & 0x67;
    uVar6 = CONCAT71(0x4c2f,bVar4) & 0xffffffffffffff67;
    if (bVar1 != (bVar5 != 0)) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5 != 0;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      IRQDelegatePortHandler::set_interrupt_status
                (&this->bus_handler_->super_IRQDelegatePortHandler,(bVar5 & (byte)uVar6) != 0);
      uVar6 = extraout_RAX_02;
    }
    bVar4 = (this->super_MOS6522Storage).registers_.output[1];
    bVar5 = (this->super_MOS6522Storage).registers_.timer_port_b_output;
    bVar2 = (this->super_MOS6522Storage).registers_.auxiliary_control;
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    bVar3 = this->bus_handler_->port_b_;
    uVar6 = CONCAT71((int7)(uVar6 >> 8),
                     (bVar4 ^ bVar3 ^ (bVar5 ^ bVar4) & bVar2 & 0x80) &
                     (this->super_MOS6522Storage).registers_.data_direction[1] ^ bVar3);
    break;
  default:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar1 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xfc;
    bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable;
    bVar5 = bVar4 & 0x7c;
    uVar6 = CONCAT71(0x4c2f,bVar4) & 0xffffffffffffff7c;
    if (bVar1 != (bVar5 != 0)) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5 != 0;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      IRQDelegatePortHandler::set_interrupt_status
                (&this->bus_handler_->super_IRQDelegatePortHandler,(bVar5 & (byte)uVar6) != 0);
      uVar6 = extraout_RAX;
    }
    bVar4 = (this->super_MOS6522Storage).registers_.data_direction[0];
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    uVar6 = CONCAT71((int7)(uVar6 >> 8),~bVar4 | (this->super_MOS6522Storage).registers_.output[0]);
    break;
  case 2:
    uVar6 = CONCAT71(0x4c2f,(this->super_MOS6522Storage).registers_.data_direction[1]);
    break;
  case 3:
    uVar6 = CONCAT71(0x4c2f,(this->super_MOS6522Storage).registers_.data_direction[0]);
    break;
  case 4:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar1 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xbf;
    bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable;
    bVar5 = bVar4 & 0x3f;
    uVar6 = CONCAT71(0x4c2f,bVar4) & 0xffffffffffffff3f;
    if (bVar1 != (bVar5 != 0)) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5 != 0;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      IRQDelegatePortHandler::set_interrupt_status
                (&this->bus_handler_->super_IRQDelegatePortHandler,(bVar5 & (byte)uVar6) != 0);
      uVar6 = extraout_RAX_03;
    }
    uVar6 = CONCAT71((int7)(uVar6 >> 8),(char)(this->super_MOS6522Storage).registers_.timer[0]);
    break;
  case 5:
    uVar6 = CONCAT71(0x4c2f,*(undefined1 *)((long)(this->super_MOS6522Storage).registers_.timer + 1)
                    );
    break;
  case 6:
    uVar6 = CONCAT71(0x4c2f,(char)(this->super_MOS6522Storage).registers_.timer_latch[0]);
    break;
  case 7:
    uVar6 = CONCAT71(0x4c2f,*(undefined1 *)
                             ((long)(this->super_MOS6522Storage).registers_.timer_latch + 1));
    break;
  case 8:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar1 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xdf;
    bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable;
    bVar5 = bVar4 & 0x5f;
    uVar6 = CONCAT71(0x4c2f,bVar4) & 0xffffffffffffff5f;
    if (bVar1 != (bVar5 != 0)) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5 != 0;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      IRQDelegatePortHandler::set_interrupt_status
                (&this->bus_handler_->super_IRQDelegatePortHandler,(bVar5 & (byte)uVar6) != 0);
      uVar6 = extraout_RAX_01;
    }
    uVar6 = CONCAT71((int7)(uVar6 >> 8),(char)(this->super_MOS6522Storage).registers_.timer[1]);
    break;
  case 9:
    uVar6 = CONCAT71(0x4c2f,*(undefined1 *)((long)(this->super_MOS6522Storage).registers_.timer + 3)
                    );
    break;
  case 10:
    (this->super_MOS6522Storage).shift_bits_remaining_ = 8;
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar1 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xfb;
    bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable;
    bVar5 = bVar4 & 0x7b;
    uVar6 = CONCAT71(0x4c2f,bVar4) & 0xffffffffffffff7b;
    if (bVar1 != (bVar5 != 0)) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5 != 0;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      IRQDelegatePortHandler::set_interrupt_status
                (&this->bus_handler_->super_IRQDelegatePortHandler,(bVar5 & (byte)uVar6) != 0);
      uVar6 = extraout_RAX_00;
    }
    uVar6 = CONCAT71((int7)(uVar6 >> 8),(this->super_MOS6522Storage).registers_.shift);
    break;
  case 0xb:
    uVar6 = CONCAT71(0x4c2f,(this->super_MOS6522Storage).registers_.auxiliary_control);
    break;
  case 0xc:
    uVar6 = CONCAT71(0x4c2f,(this->super_MOS6522Storage).registers_.peripheral_control);
    break;
  case 0xd:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    uVar6 = CONCAT71(0x4c2f,(((this->super_MOS6522Storage).registers_.interrupt_enable & bVar4 &
                             0x7f) != 0) << 7 | bVar4);
    break;
  case 0xe:
    uVar6 = CONCAT71(0x4c2f,(this->super_MOS6522Storage).registers_.interrupt_enable) | 0x80;
  }
  return uVar6;
}

Assistant:

uint8_t MOS6522<T>::read(int address) {
	address &= 0xf;
	access(address);
	switch(address) {
		case 0x0:	// Read Port B ('IRB').
			registers_.interrupt_flags &= ~(InterruptFlag::CB1ActiveEdge | InterruptFlag::CB2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::B, registers_.data_direction[1], registers_.output[1], registers_.auxiliary_control & 0x80);
		case 0xf:
		case 0x1:	// Read Port A ('IRA').
			registers_.interrupt_flags &= ~(InterruptFlag::CA1ActiveEdge | InterruptFlag::CA2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::A, registers_.data_direction[0], registers_.output[0], 0);

		case 0x2:	return registers_.data_direction[1];	// Port B direction ('DDRB').
		case 0x3:	return registers_.data_direction[0];	// Port A direction ('DDRA').

		// Timer 1
		case 0x4:	// Timer 1 low-order latches ('T1L-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer1;
			reevaluate_interrupts();
		return registers_.timer[0] & 0x00ff;
		case 0x5:	return registers_.timer[0] >> 8;			// Timer 1 high-order counter ('T1C-H')
		case 0x6:	return registers_.timer_latch[0] & 0x00ff;	// Timer 1 low-order latches ('T1L-L').
		case 0x7:	return registers_.timer_latch[0] >> 8;		// Timer 1 high-order latches ('T1L-H').

		// Timer 2
		case 0x8:	// Timer 2 low-order counter ('T2C-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer2;
			reevaluate_interrupts();
		return registers_.timer[1] & 0x00ff;
		case 0x9:	return registers_.timer[1] >> 8;	// Timer 2 high-order counter ('T2C-H').

		case 0xa:	// Shift register ('SR').
			shift_bits_remaining_ = 8;
			registers_.interrupt_flags &= ~InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		return registers_.shift;

		case 0xb:	return registers_.auxiliary_control;	// Auxiliary control ('ACR').
		case 0xc:	return registers_.peripheral_control;	// Peripheral control ('PCR').

		case 0xd:	return registers_.interrupt_flags | (get_interrupt_line() ? 0x80 : 0x00);	// Interrupt flag register ('IFR').
		case 0xe:	return registers_.interrupt_enable | 0x80;									// Interrupt enable register ('IER').
	}

	return 0xff;
}